

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::basicFeasibilityChangeBtran(HEkkPrimal *this)

{
  HighsSimplexAnalysis *in_RDI;
  double dVar1;
  double local_col_basic_feasibility_change_density;
  HighsInt solver_num_row;
  undefined4 in_stack_ffffffffffffffd8;
  HighsInt in_stack_ffffffffffffffdc;
  HVector *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar2;
  
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             (HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
             (HighsInt)in_stack_ffffffffffffffe8);
  iVar2 = *(int *)((long)&in_RDI->timer_[0x3f].clock_num_call.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4);
  if ((*(byte *)((long)&(in_RDI->thread_simplex_clocks).
                        super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                        _M_impl.super__Vector_impl_data._M_start[7].clock_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 9) & 1) != 0) {
    HighsSimplexAnalysis::operationRecordBefore
              ((HighsSimplexAnalysis *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
               (HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(HVector *)in_RDI,
               (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  HSimplexNla::btran((HSimplexNla *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                     in_stack_ffffffffffffffe8,(double)in_RDI,
                     (HighsTimerClock *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if ((*(byte *)((long)&(in_RDI->thread_simplex_clocks).
                        super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                        _M_impl.super__Vector_impl_data._M_start[7].clock_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 9) & 1) != 0) {
    HighsSimplexAnalysis::operationRecordAfter(in_RDI,in_stack_ffffffffffffffdc,(HVector *)0x7af7e7)
    ;
  }
  dVar1 = (double)*(int *)((long)&(in_RDI->before_ftran_upper_hyper_density).count_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + 4) / (double)iVar2;
  HEkk::updateOperationResultDensity
            ((HEkk *)in_RDI->timer_,dVar1,&in_RDI->timer_[0x4c].initial_clock_start);
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
             (HighsInt)((ulong)dVar1 >> 0x20),SUB84(dVar1,0));
  return;
}

Assistant:

void HEkkPrimal::basicFeasibilityChangeBtran() {
  // Performs BTRAN on col_basic_feasibility_change. Make sure that
  // col_basic_feasibility_change.count is large (>lp_.num_row_ to be
  // sure) rather than 0 if the indices of the RHS (and true value of
  // col_basic_feasibility_change.count) isn't known.
  analysis->simplexTimerStart(BtranBasicFeasibilityChangeClock);
  const HighsInt solver_num_row = ekk_instance_.lp_.num_row_;
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(
        kSimplexNlaBtranBasicFeasibilityChange, col_basic_feasibility_change,
        ekk_instance_.info_.col_basic_feasibility_change_density);
  ekk_instance_.simplex_nla_.btran(
      col_basic_feasibility_change,
      ekk_instance_.info_.col_basic_feasibility_change_density,
      analysis->pointer_serial_factor_clocks);

  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaBtranBasicFeasibilityChange,
                                   col_basic_feasibility_change);
  const double local_col_basic_feasibility_change_density =
      (double)col_basic_feasibility_change.count / solver_num_row;
  ekk_instance_.updateOperationResultDensity(
      local_col_basic_feasibility_change_density,
      ekk_instance_.info_.col_basic_feasibility_change_density);
  analysis->simplexTimerStop(BtranBasicFeasibilityChangeClock);
}